

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_pool.cpp
# Opt level: O1

void __thiscall
cppcms::session_pool::storage
          (session_pool *this,
          unique_ptr<cppcms::sessions::session_storage_factory,_std::default_delete<cppcms::sessions::session_storage_factory>_>
          *s)

{
  session_storage_factory *psVar1;
  session_storage_factory *psVar2;
  
  psVar1 = (s->_M_t).
           super___uniq_ptr_impl<cppcms::sessions::session_storage_factory,_std::default_delete<cppcms::sessions::session_storage_factory>_>
           ._M_t.
           super__Tuple_impl<0UL,_cppcms::sessions::session_storage_factory_*,_std::default_delete<cppcms::sessions::session_storage_factory>_>
           .super__Head_base<0UL,_cppcms::sessions::session_storage_factory_*,_false>._M_head_impl;
  (s->_M_t).
  super___uniq_ptr_impl<cppcms::sessions::session_storage_factory,_std::default_delete<cppcms::sessions::session_storage_factory>_>
  ._M_t.
  super__Tuple_impl<0UL,_cppcms::sessions::session_storage_factory_*,_std::default_delete<cppcms::sessions::session_storage_factory>_>
  .super__Head_base<0UL,_cppcms::sessions::session_storage_factory_*,_false>._M_head_impl =
       (session_storage_factory *)0x0;
  psVar2 = (this->storage_)._M_t.
           super___uniq_ptr_impl<cppcms::sessions::session_storage_factory,_std::default_delete<cppcms::sessions::session_storage_factory>_>
           ._M_t.
           super__Tuple_impl<0UL,_cppcms::sessions::session_storage_factory_*,_std::default_delete<cppcms::sessions::session_storage_factory>_>
           .super__Head_base<0UL,_cppcms::sessions::session_storage_factory_*,_false>._M_head_impl;
  (this->storage_)._M_t.
  super___uniq_ptr_impl<cppcms::sessions::session_storage_factory,_std::default_delete<cppcms::sessions::session_storage_factory>_>
  ._M_t.
  super__Tuple_impl<0UL,_cppcms::sessions::session_storage_factory_*,_std::default_delete<cppcms::sessions::session_storage_factory>_>
  .super__Head_base<0UL,_cppcms::sessions::session_storage_factory_*,_false>._M_head_impl = psVar1;
  if (psVar2 != (session_storage_factory *)0x0) {
    (*psVar2->_vptr_session_storage_factory[4])();
    return;
  }
  return;
}

Assistant:

void session_pool::storage(std::unique_ptr<sessions::session_storage_factory> s)
{
	storage_=std::move(s);
}